

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

void __thiscall ncnn::Proposal::Proposal(Proposal *this)

{
  Mat *this_00;
  float *pfVar1;
  float *_elemsize;
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffa0;
  Allocator *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  int _w;
  Mat *in_stack_ffffffffffffffc0;
  
  _w = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  Layer::Layer(in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__Proposal_001b4ab0;
  Mat::Mat((Mat *)(in_RDI + 0x13));
  Mat::Mat((Mat *)(in_RDI + 0x1b));
  Mat::Mat((Mat *)(in_RDI + 0x23));
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  Mat::create(in_stack_ffffffffffffffc0,_w,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (Mat *)Mat::operator[]((Mat *)(in_RDI + 0x13),0);
  *(float *)&this_00->data = 0.5;
  pfVar1 = Mat::operator[]((Mat *)(in_RDI + 0x13),1);
  *pfVar1 = 1.0;
  _elemsize = Mat::operator[]((Mat *)(in_RDI + 0x13),2);
  *_elemsize = 2.0;
  Mat::create(this_00,(int)((ulong)pfVar1 >> 0x20),(size_t)_elemsize,in_stack_ffffffffffffffa8);
  pfVar1 = Mat::operator[]((Mat *)(in_RDI + 0x1b),0);
  *pfVar1 = 8.0;
  pfVar1 = Mat::operator[]((Mat *)(in_RDI + 0x1b),1);
  *pfVar1 = 16.0;
  pfVar1 = Mat::operator[]((Mat *)(in_RDI + 0x1b),2);
  *pfVar1 = 32.0;
  return;
}

Assistant:

Proposal::Proposal()
{
    one_blob_only = false;
    support_inplace = false;

    // TODO load from param
    ratios.create(3);
    ratios[0] = 0.5f;
    ratios[1] = 1.f;
    ratios[2] = 2.f;

    scales.create(3);
    scales[0] = 8.f;
    scales[1] = 16.f;
    scales[2] = 32.f;
}